

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O2

type_conflict1 __thiscall
llvm::StringRef::getAsInteger<unsigned_int>(StringRef *this,uint Radix,uint *Result)

{
  bool bVar1;
  type_conflict1 tVar2;
  ulong in_RAX;
  unsigned_long_long *in_R8;
  StringRef Str;
  ulong local_18;
  unsigned_long_long ULLVal;
  
  Str.Length._0_4_ = Radix;
  Str.Data = (char *)this->Length;
  Str.Length._4_4_ = 0;
  local_18 = in_RAX;
  bVar1 = getAsUnsignedInteger((llvm *)this->Data,Str,(uint)&local_18,in_R8);
  tVar2 = true;
  if ((!bVar1) && (local_18 >> 0x20 == 0)) {
    *Result = (uint)local_18;
    tVar2 = false;
  }
  return tVar2;
}

Assistant:

typename std::enable_if<!std::numeric_limits<T>::is_signed, bool>::type
    getAsInteger(unsigned Radix, T &Result) const {
      unsigned long long ULLVal;
      // The additional cast to unsigned long long is required to avoid the
      // Visual C++ warning C4805: '!=' : unsafe mix of type 'bool' and type
      // 'unsigned __int64' when instantiating getAsInteger with T = bool.
      if (getAsUnsignedInteger(*this, Radix, ULLVal) ||
          static_cast<unsigned long long>(static_cast<T>(ULLVal)) != ULLVal)
        return true;
      Result = ULLVal;
      return false;
    }